

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_case_name,char *name,char *type_param,char *value_param,
          TypeId fixture_class_id,SetUpTestCaseFunc set_up_tc,TearDownTestCaseFunc tear_down_tc,
          TestFactoryBase *factory)

{
  TestInfo *this;
  UnitTestImpl *this_00;
  allocator local_7a;
  allocator local_79;
  SetUpTestCaseFunc local_78;
  string local_70;
  string local_50;
  
  local_78 = set_up_tc;
  this = (TestInfo *)operator_new(0xe0);
  std::__cxx11::string::string((string *)&local_50,test_case_name,&local_79);
  std::__cxx11::string::string((string *)&local_70,name,&local_7a);
  TestInfo::TestInfo(this,&local_50,&local_70,type_param,value_param,fixture_class_id,factory);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = GetUnitTestImpl();
  UnitTestImpl::AddTestInfo(this_00,local_78,tear_down_tc,this);
  return this;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_case_name,
    const char* name,
    const char* type_param,
    const char* value_param,
    TypeId fixture_class_id,
    SetUpTestCaseFunc set_up_tc,
    TearDownTestCaseFunc tear_down_tc,
    TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_case_name, name, type_param, value_param,
                   fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}